

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

MATCH_RESULT llbuild::basic::sys::filenameMatch(string *pattern,string *filename)

{
  int iVar1;
  char *__pattern;
  char *__name;
  undefined4 local_2c;
  int result;
  string *filename_local;
  string *pattern_local;
  
  __pattern = (char *)std::__cxx11::string::c_str();
  __name = (char *)std::__cxx11::string::c_str();
  iVar1 = fnmatch(__pattern,__name,0);
  if (iVar1 == 0) {
    local_2c = MATCH;
  }
  else {
    local_2c = MATCH_ERROR;
    if (iVar1 == 1) {
      local_2c = NO_MATCH;
    }
  }
  return local_2c;
}

Assistant:

sys::MATCH_RESULT sys::filenameMatch(const std::string& pattern,
                                     const std::string& filename) {
#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> wpattern;
  llvm::SmallVector<llvm::UTF16, 20> wfilename;

  llvm::convertUTF8ToUTF16String(pattern, wpattern);
  llvm::convertUTF8ToUTF16String(filename, wfilename);

  bool result =
      PathMatchSpecW((LPCWSTR)wfilename.data(), (LPCWSTR)wpattern.data());
  return result ? sys::MATCH : sys::NO_MATCH;
#else
  int result = fnmatch(pattern.c_str(), filename.c_str(), 0);
  return result == 0 ? sys::MATCH
                     : result == FNM_NOMATCH ? sys::NO_MATCH : sys::MATCH_ERROR;
#endif
}